

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

int __thiscall BinGE<5,_0,_1>::checkSatisfied(BinGE<5,_0,_1> *this)

{
  Tchar *pTVar1;
  int iVar2;
  int *pt;
  TrailElem local_18;
  
  if ((this->super_Propagator).satisfied.v != '\0') {
    return 1;
  }
  pTVar1 = &(this->super_Propagator).satisfied;
  local_18.pt = (int *)pTVar1;
  if ((uint)(this->r).s * 2 + -1 == (int)sat.assigns.data[(uint)(this->r).v]) {
    local_18.x = 0;
    local_18.sz = 1;
    vec<TrailElem>::push(&engine.trail,&local_18);
    iVar2 = 1;
  }
  else {
    if ((long)(this->x).b - (long)(((this->x).var)->max).v < (long)(((this->y).var)->max).v) {
      return 3;
    }
    local_18.x = 0;
    local_18.sz = 1;
    vec<TrailElem>::push(&engine.trail,&local_18);
    iVar2 = 3;
  }
  pTVar1->v = '\x01';
  return iVar2;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if (r.isFalse()) {
			satisfied = true;
			return 1;
		}
		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}
		return 3;
	}